

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O3

pair<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>
* __thiscall
jessilib::
word_split_once<std::vector<wchar_t,std::allocator<wchar_t>>,__gnu_cxx::__normal_iterator<wchar_t_const*,std::vector<wchar_t,std::allocator<wchar_t>>>,__gnu_cxx::__normal_iterator<wchar_t_const*,std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>
          (pair<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> begin,
          __normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> end,
          wchar_t in_whitespace)

{
  pointer pwVar1;
  pointer pwVar2;
  wchar_t wVar3;
  __normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> __first;
  allocator_type local_89;
  pointer local_88;
  pointer pwStack_80;
  pointer local_78;
  pointer local_68;
  pointer pwStack_60;
  pointer local_58;
  pointer pwStack_50;
  pointer local_48;
  pointer pwStack_40;
  pointer local_38;
  pointer pwStack_30;
  
  local_48 = (pointer)0x0;
  pwStack_40 = (pointer)0x0;
  local_58 = (pointer)0x0;
  pwStack_50 = (pointer)0x0;
  local_68 = (pointer)0x0;
  pwStack_60 = (pointer)0x0;
  if (this < begin._M_current) {
    do {
      wVar3 = (wchar_t)end._M_current;
      __first._M_current = (wchar_t *)this;
      if (*(wchar_t *)this != wVar3) break;
      this = this + 4;
      __first._M_current = (wchar_t *)this;
    } while (this != (jessilib *)begin._M_current);
    do {
      if (this == (jessilib *)begin._M_current) goto LAB_003f63ec;
      if (*(wchar_t *)this == wVar3) {
        std::vector<wchar_t,std::allocator<wchar_t>>::
        vector<__gnu_cxx::__normal_iterator<wchar_t_const*,std::vector<wchar_t,std::allocator<wchar_t>>>,void>
                  ((vector<wchar_t,std::allocator<wchar_t>> *)&local_88,__first,
                   (__normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>
                    )this,&local_89);
        pwVar2 = local_58;
        pwVar1 = local_68;
        local_68 = local_88;
        pwStack_60 = pwStack_80;
        local_58 = local_78;
        local_88 = (pointer)0x0;
        pwStack_80 = (pointer)0x0;
        local_78 = (pointer)0x0;
        if ((pwVar1 != (pointer)0x0) &&
           (operator_delete(pwVar1,(long)pwVar2 - (long)pwVar1), local_88 != (pointer)0x0)) {
          operator_delete(local_88,(long)local_78 - (long)local_88);
        }
        goto LAB_003f64f0;
      }
      this = (jessilib *)((long)this + 4);
    } while( true );
  }
  (__return_storage_ptr__->first).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pwStack_40 = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
LAB_003f6475:
  (__return_storage_ptr__->second).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pwStack_40;
  return __return_storage_ptr__;
LAB_003f63ec:
  std::vector<wchar_t,std::allocator<wchar_t>>::
  vector<__gnu_cxx::__normal_iterator<wchar_t_const*,std::vector<wchar_t,std::allocator<wchar_t>>>,void>
            ((vector<wchar_t,std::allocator<wchar_t>> *)&local_88,__first,begin,&local_89);
  pwVar1 = local_78;
  local_38 = local_88;
  pwStack_30 = pwStack_80;
  local_88 = (pointer)0x0;
  pwStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  if ((local_68 != (pointer)0x0) &&
     (operator_delete(local_68,(long)local_58 - (long)local_68), local_88 != (pointer)0x0)) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  (__return_storage_ptr__->first).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_start = local_38;
  (__return_storage_ptr__->first).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_finish = pwStack_30;
  (__return_storage_ptr__->first).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pwVar1;
  (__return_storage_ptr__->second).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_start = pwStack_50;
  (__return_storage_ptr__->second).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_finish = local_48;
  goto LAB_003f6475;
  while (*(wchar_t *)this == wVar3) {
LAB_003f64f0:
    this = (jessilib *)((long)this + 4);
    if (this == (jessilib *)begin._M_current) break;
  }
  std::vector<wchar_t,std::allocator<wchar_t>>::
  vector<__gnu_cxx::__normal_iterator<wchar_t_const*,std::vector<wchar_t,std::allocator<wchar_t>>>,void>
            ((vector<wchar_t,std::allocator<wchar_t>> *)&local_88,
             (__normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
             this,begin,&local_89);
  pwVar1 = local_78;
  local_38 = local_88;
  pwStack_30 = pwStack_80;
  local_88 = (pointer)0x0;
  pwStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  if ((pwStack_50 != (pointer)0x0) &&
     (operator_delete(pwStack_50,(long)pwStack_40 - (long)pwStack_50), local_88 != (pointer)0x0)) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  (__return_storage_ptr__->first).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_start = local_68;
  (__return_storage_ptr__->first).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_finish = pwStack_60;
  (__return_storage_ptr__->first).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_58;
  (__return_storage_ptr__->second).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_start = local_38;
  (__return_storage_ptr__->second).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_finish = pwStack_30;
  (__return_storage_ptr__->second).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pwVar1;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}